

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mgtransport.c
# Opt level: O0

int mg_raw_transport_recv(mg_transport *transport,char *buf,size_t len)

{
  ssize_t sVar1;
  ulong in_RDX;
  void *in_RSI;
  undefined8 in_RDI;
  ssize_t received_now;
  size_t total_received;
  int sockfd;
  ulong local_30;
  
  local_30 = 0;
  while( true ) {
    if (in_RDX <= local_30) {
      return 0;
    }
    sVar1 = mg_socket_receive((int)((ulong)in_RDI >> 0x20),in_RSI,(int)(in_RDX >> 0x20));
    if (sVar1 == 0) break;
    if (sVar1 == -1) {
      perror("mg_raw_transport_recv");
      return -1;
    }
    local_30 = sVar1 + local_30;
  }
  fprintf(_stderr,"mg_raw_transport_recv: connection closed by server\n");
  return -1;
}

Assistant:

int mg_raw_transport_recv(struct mg_transport *transport, char *buf,
                          size_t len) {
  int sockfd = ((mg_raw_transport *)transport)->sockfd;
  size_t total_received = 0;
  while (total_received < len) {
    ssize_t received_now =
        mg_socket_receive(sockfd, buf + total_received, len - total_received);
    if (received_now == 0) {
      // Server closed the connection.
      fprintf(stderr, "mg_raw_transport_recv: connection closed by server\n");
      return -1;
    }
    if (received_now == -1) {
      perror("mg_raw_transport_recv");
      return -1;
    }
    total_received += (size_t)received_now;
  }
  return 0;
}